

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgaussrule.cpp
# Opt level: O1

longdouble * __thiscall
TPZGaussRule::JacobiPolinomial
          (longdouble *__return_storage_ptr__,TPZGaussRule *this,longdouble x,int alpha,int beta,
          uint n)

{
  int iVar1;
  int iVar2;
  longdouble *extraout_RAX;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  longdouble lVar10;
  TPZVec<long_double> p;
  TPZVec<long_double> local_50;
  
  iVar7 = (int)this;
  TPZVec<long_double>::TPZVec(&local_50,(ulong)(beta + 1));
  *local_50.fStore = (longdouble)1;
  if (beta != 0) {
    iVar1 = alpha + iVar7;
    local_50.fStore[1] =
         (((longdouble)iVar1 + (longdouble)2.0) * x + (longdouble)(iVar7 - alpha)) * (longdouble)0.5
    ;
    if (beta != 1) {
      lVar10 = local_50.fStore[1];
      iVar3 = (iVar7 - alpha) * iVar1;
      iVar8 = (alpha + iVar7 + 3) * iVar3;
      lVar9 = 0;
      lVar4 = 0;
      do {
        iVar2 = (int)lVar4;
        iVar5 = iVar1 + iVar2 + 2;
        iVar6 = iVar1 + iVar2 + 4;
        lVar10 = ((x * (longdouble)((iVar1 + iVar2 + 3) * iVar5 * iVar6) + (longdouble)iVar8) *
                  lVar10 - *(longdouble *)((long)local_50.fStore + lVar4 * 8) *
                           (longdouble)((alpha + (int)lVar9 + 1) * (iVar7 * 2 + 2 + iVar2) * iVar6))
                 / (longdouble)((iVar1 + (int)lVar9 + 2) * (iVar2 + 4) * iVar5);
        *(longdouble *)((long)local_50.fStore + lVar4 * 8 + 0x20) = lVar10;
        lVar4 = lVar4 + 2;
        iVar8 = iVar8 + iVar3 * 2;
        lVar9 = lVar9 + 1;
      } while ((ulong)(uint)beta - 1 != lVar9);
    }
  }
  local_50._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  operator_delete__(local_50.fStore);
  return extraout_RAX;
}

Assistant:

long double TPZGaussRule::JacobiPolinomial(long double x,int alpha,int beta,unsigned int n) {
	// the Jacobi polynomial is evaluated
	// using a recursion formula.
	TPZVec<long double> p(n+1);
	int v, a1, a2, a3, a4;
	
	// initial values P_0(x), P_1(x):
	p[0] = 1.0L;
	if(n==0) return p[0];
	p[1] = (((long double)(alpha+beta+2.0L))*x + ((long double)(alpha-beta)))/2.0L;
	if(n==1) return p[1];
	
	for(unsigned int i=1; i<=(n-1); ++i) {
		v  = 2*i + alpha + beta;
		a1 = 2*(i+1)*(i + alpha + beta + 1)*v;
		a2 = (v + 1)*(alpha*alpha - beta*beta);
		a3 = v*(v + 1)*(v + 2);
		a4 = 2*(i+alpha)*(i+beta)*(v + 2);
		
		p[i+1] = static_cast<long double>( (((long double)(a2)) + ((long double)(a3))*x)*p[i] - ((long double)(a4))*p[i-1])/((long double)(a1));
    } // for
	return p[n];
}